

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int init_decompression(archive_read *a,_7zip_conflict *zip,_7z_coder *coder1,_7z_coder *coder2)

{
  byte bVar1;
  long lVar2;
  uint32_t uVar3;
  unsigned_long *in_RCX;
  unsigned_long *in_RDX;
  _7zip_conflict *in_RSI;
  archive *in_RDI;
  bool bVar4;
  uint32_t msize;
  uint order;
  int fi;
  lzma_filter filters [4];
  lzma_options_delta delta_opt;
  int r;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  CPpmd7 *in_stack_ffffffffffffff40;
  CPpmd7 *p;
  CPpmd7 *p_00;
  uint local_9c;
  undefined4 *local_98 [8];
  undefined4 local_58;
  undefined4 local_54;
  int local_2c;
  unsigned_long *local_28;
  unsigned_long *local_20;
  _7zip_conflict *local_18;
  archive *local_10;
  
  in_RSI->codec = *in_RDX;
  in_RSI->codec2 = 0xffffffffffffffff;
  p_00 = (CPpmd7 *)in_RSI->codec;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (((((p_00 == (CPpmd7 *)0x0) || (p_00 == (CPpmd7 *)0x30401)) || (p_00 == (CPpmd7 *)0x40108)) ||
      (p_00 == (CPpmd7 *)0x40202)) && (in_RCX != (unsigned_long *)0x0)) {
    if ((*in_RCX != 0x3030103) && (*in_RCX != 0x303011b)) {
      archive_set_error(in_RDI,-1,"Unsupported filter %lx for %lx",*in_RCX,*in_RDX);
      return -0x19;
    }
    in_RSI->codec2 = *in_RCX;
    in_RSI->bcj_state = 0;
    if (*in_RCX == 0x3030103) {
      x86_Init(in_RSI);
    }
  }
  p = (CPpmd7 *)local_18->codec;
  if (p != (CPpmd7 *)0x0) {
    if (p == (CPpmd7 *)0x3) {
LAB_001af8bd:
      archive_set_error(local_10,-1,"Unexpected codec ID: %lX",local_18->codec);
      return -0x19;
    }
    if ((p == (CPpmd7 *)0x21) || (p == (CPpmd7 *)0x30101)) {
      local_9c = 0;
      if (local_18->lzstream_valid != 0) {
        lzma_end(&local_18->lzstream);
        local_18->lzstream_valid = 0;
      }
      if (local_28 != (unsigned_long *)0x0) {
        local_18->codec2 = *local_28;
        local_98[1] = (undefined4 *)0x0;
        in_stack_ffffffffffffff40 = (CPpmd7 *)local_18->codec2;
        if (in_stack_ffffffffffffff40 == (CPpmd7 *)0x3) {
          local_98[0] = (undefined4 *)0x3;
          memset(&local_58,0,0x28);
          local_58 = 0;
          local_54 = 1;
          local_98[1] = &local_58;
          local_9c = 1;
        }
        else if (in_stack_ffffffffffffff40 == (CPpmd7 *)0x3030103) {
          bVar4 = local_18->codec != 0x21;
          if (bVar4) {
            x86_Init(local_18);
          }
          else {
            local_98[0] = (undefined4 *)0x4;
          }
          local_9c = (uint)!bVar4;
        }
        else if (in_stack_ffffffffffffff40 == (CPpmd7 *)0x303011b) {
          local_18->bcj_state = 0;
        }
        else if (in_stack_ffffffffffffff40 == (CPpmd7 *)0x3030205) {
          local_98[0] = (undefined4 *)0x5;
          local_9c = 1;
        }
        else if (in_stack_ffffffffffffff40 == (CPpmd7 *)0x3030401) {
          local_98[0] = (undefined4 *)0x6;
          local_9c = 1;
        }
        else if (in_stack_ffffffffffffff40 == (CPpmd7 *)0x3030501) {
          local_98[0] = (undefined4 *)0x7;
          local_9c = 1;
        }
        else if (in_stack_ffffffffffffff40 == (CPpmd7 *)0x3030701) {
          local_98[0] = (undefined4 *)0x8;
          local_9c = 1;
        }
        else {
          if (in_stack_ffffffffffffff40 != (CPpmd7 *)0x3030805) {
            archive_set_error(local_10,-1,"Unexpected codec ID: %lX",local_18->codec2);
            return -0x19;
          }
          local_98[0] = (undefined4 *)0x9;
          local_9c = 1;
        }
      }
      if (local_18->codec == 0x21) {
        local_98[(long)(int)local_9c * 2] = (undefined4 *)0x21;
      }
      else {
        local_98[(long)(int)local_9c * 2] = (undefined4 *)0x4000000000000001;
      }
      local_98[(long)(int)local_9c * 2 + 1] = (undefined4 *)0x0;
      local_2c = lzma_properties_decode
                           (local_98 + (long)(int)local_9c * 2,0,local_20[4],local_20[3]);
      if (local_2c != 0) {
        set_error((archive_read *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        return -0x19;
      }
      local_98[(long)(int)(local_9c + 1) * 2] = (undefined4 *)0xffffffffffffffff;
      local_98[(long)(int)(local_9c + 1) * 2 + 1] = (undefined4 *)0x0;
      local_2c = lzma_raw_decoder(&local_18->lzstream,local_98);
      if (local_2c != 0) {
        set_error((archive_read *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        return -0x19;
      }
      local_18->lzstream_valid = 1;
      (local_18->lzstream).total_in = 0;
      (local_18->lzstream).total_out = 0;
    }
    else if (p == (CPpmd7 *)0x30401) {
      if (local_18->ppmd7_valid != 0) {
        Ppmd7_Free(in_stack_ffffffffffffff40,
                   (ISzAlloc *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        local_18->ppmd7_valid = 0;
      }
      if (local_20[3] < 5) {
        archive_set_error(local_10,-1,"Malformed PPMd parameter");
        return -0x19;
      }
      bVar1 = *(byte *)local_20[4];
      uVar3 = archive_le32dec((void *)(local_20[4] + 1));
      if ((((bVar1 < 2) || (0x40 < bVar1)) || (uVar3 < 0x800)) || (0xffffffdb < uVar3)) {
        archive_set_error(local_10,-1,"Malformed PPMd parameter");
        return -0x19;
      }
      Ppmd7_Construct(p_00);
      local_2c = Ppmd7_Alloc(p,(UInt32)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                             (ISzAlloc *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (local_2c == 0) {
        archive_set_error(local_10,0xc,"Coludn\'t allocate memory for PPMd");
        return -0x1e;
      }
      Ppmd7_Init(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      Ppmd7z_RangeDec_CreateVTable(&local_18->range_dec);
      local_18->ppmd7_valid = 1;
      local_18->ppmd7_stat = 0;
      (local_18->ppstream).overconsumed = 0;
      (local_18->ppstream).total_in = 0;
      (local_18->ppstream).total_out = 0;
    }
    else {
      if (p != (CPpmd7 *)0x40108) {
        if (p == (CPpmd7 *)0x40202) {
          archive_set_error(local_10,-1,"BZ2 codec is unsupported");
          return -0x19;
        }
        if ((((p != (CPpmd7 *)0x3030103) && (p != (CPpmd7 *)0x303011b)) &&
            ((p != (CPpmd7 *)0x3030205 && ((p != (CPpmd7 *)0x3030401 && (p != (CPpmd7 *)0x3030501)))
             ))) && ((p != (CPpmd7 *)0x3030701 && (p != (CPpmd7 *)0x3030805)))) {
          if (((p != (CPpmd7 *)0x6f10101) && (p != (CPpmd7 *)0x6f10303)) &&
             (p != (CPpmd7 *)0x6f10701)) {
            archive_set_error(local_10,-1,"Unknown codec ID: %lX",local_18->codec);
            return -0x19;
          }
          lVar2._0_4_ = local_10[1].magic;
          lVar2._4_4_ = local_10[1].state;
          if (lVar2 != 0) {
            archive_entry_set_is_metadata_encrypted(*(archive_entry **)(local_10 + 1),'\x01');
            archive_entry_set_is_data_encrypted(*(archive_entry **)(local_10 + 1),'\x01');
            local_18->has_encrypted_entries = 1;
          }
          archive_set_error(local_10,-1,"Crypto codec not supported yet (ID: 0x%lX)",local_18->codec
                           );
          return -0x19;
        }
        goto LAB_001af8bd;
      }
      if (local_18->stream_valid == 0) {
        local_2c = inflateInit2_(&local_18->stream,0xfffffff1,"1.2.11",0x70);
      }
      else {
        local_2c = inflateReset(&local_18->stream);
      }
      if (local_2c != 0) {
        archive_set_error(local_10,-1,"Couldn\'t initialize zlib stream.");
        return -0x19;
      }
      local_18->stream_valid = 1;
      (local_18->stream).total_in = 0;
      (local_18->stream).total_out = 0;
    }
  }
  return 0;
}

Assistant:

static int
init_decompression(struct archive_read *a, struct _7zip *zip,
    const struct _7z_coder *coder1, const struct _7z_coder *coder2)
{
	int r;

	zip->codec = coder1->codec;
	zip->codec2 = -1;

	switch (zip->codec) {
	case _7Z_COPY:
	case _7Z_BZ2:
	case _7Z_DEFLATE:
	case _7Z_PPMD:
		if (coder2 != NULL) {
			if (coder2->codec != _7Z_X86 &&
			    coder2->codec != _7Z_X86_BCJ2) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Unsupported filter %lx for %lx",
				    coder2->codec, coder1->codec);
				return (ARCHIVE_FAILED);
			}
			zip->codec2 = coder2->codec;
			zip->bcj_state = 0;
			if (coder2->codec == _7Z_X86)
				x86_Init(zip);
		}
		break;
	default:
		break;
	}

	switch (zip->codec) {
	case _7Z_COPY:
		break;

	case _7Z_LZMA: case _7Z_LZMA2:
#ifdef HAVE_LZMA_H
#if LZMA_VERSION_MAJOR >= 5
/* Effectively disable the limiter. */
#define LZMA_MEMLIMIT   UINT64_MAX
#else
/* NOTE: This needs to check memory size which running system has. */
#define LZMA_MEMLIMIT   (1U << 30)
#endif
	{
		lzma_options_delta delta_opt;
		lzma_filter filters[LZMA_FILTERS_MAX];
#if LZMA_VERSION < 50010000
		lzma_filter *ff;
#endif
		int fi = 0;

		if (zip->lzstream_valid) {
			lzma_end(&(zip->lzstream));
			zip->lzstream_valid = 0;
		}

		/*
		 * NOTE: liblzma incompletely handle the BCJ+LZMA compressed
		 * data made by 7-Zip because 7-Zip does not add End-Of-
		 * Payload Marker(EOPM) at the end of LZMA compressed data,
		 * and so liblzma cannot know the end of the compressed data
		 * without EOPM. So consequently liblzma will not return last
		 * three or four bytes of uncompressed data because
		 * LZMA_FILTER_X86 filter does not handle input data if its
		 * data size is less than five bytes. If liblzma detect EOPM
		 * or know the uncompressed data size, liblzma will flush out
		 * the remaining that three or four bytes of uncompressed
		 * data. That is why we have to use our converting program
		 * for BCJ+LZMA. If we were able to tell the uncompressed
		 * size to liblzma when using lzma_raw_decoder() liblzma
		 * could correctly deal with BCJ+LZMA. But unfortunately
		 * there is no way to do that.
		 * Discussion about this can be found at XZ Utils forum.
		 */
		if (coder2 != NULL) {
			zip->codec2 = coder2->codec;

			filters[fi].options = NULL;
			switch (zip->codec2) {
			case _7Z_X86:
				if (zip->codec == _7Z_LZMA2) {
					filters[fi].id = LZMA_FILTER_X86;
					fi++;
				} else
					/* Use our filter. */
					x86_Init(zip);
				break;
			case _7Z_X86_BCJ2:
				/* Use our filter. */
				zip->bcj_state = 0;
				break;
			case _7Z_DELTA:
				filters[fi].id = LZMA_FILTER_DELTA;
				memset(&delta_opt, 0, sizeof(delta_opt));
				delta_opt.type = LZMA_DELTA_TYPE_BYTE;
				delta_opt.dist = 1;
				filters[fi].options = &delta_opt;
				fi++;
				break;
			/* Following filters have not been tested yet. */
			case _7Z_POWERPC:
				filters[fi].id = LZMA_FILTER_POWERPC;
				fi++;
				break;
			case _7Z_IA64:
				filters[fi].id = LZMA_FILTER_IA64;
				fi++;
				break;
			case _7Z_ARM:
				filters[fi].id = LZMA_FILTER_ARM;
				fi++;
				break;
			case _7Z_ARMTHUMB:
				filters[fi].id = LZMA_FILTER_ARMTHUMB;
				fi++;
				break;
			case _7Z_SPARC:
				filters[fi].id = LZMA_FILTER_SPARC;
				fi++;
				break;
			default:
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Unexpected codec ID: %lX", zip->codec2);
				return (ARCHIVE_FAILED);
			}
		}

		if (zip->codec == _7Z_LZMA2)
			filters[fi].id = LZMA_FILTER_LZMA2;
		else
			filters[fi].id = LZMA_FILTER_LZMA1;
		filters[fi].options = NULL;
#if LZMA_VERSION < 50010000
		ff = &filters[fi];
#endif
		r = lzma_properties_decode(&filters[fi], NULL,
		    coder1->properties, (size_t)coder1->propertiesSize);
		if (r != LZMA_OK) {
			set_error(a, r);
			return (ARCHIVE_FAILED);
		}
		fi++;

		filters[fi].id = LZMA_VLI_UNKNOWN;
		filters[fi].options = NULL;
		r = lzma_raw_decoder(&(zip->lzstream), filters);
#if LZMA_VERSION < 50010000
		free(ff->options);
#endif
		if (r != LZMA_OK) {
			set_error(a, r);
			return (ARCHIVE_FAILED);
		}
		zip->lzstream_valid = 1;
		zip->lzstream.total_in = 0;
		zip->lzstream.total_out = 0;
		break;
	}
#else
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "LZMA codec is unsupported");
		return (ARCHIVE_FAILED);
#endif
	case _7Z_BZ2:
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
		if (zip->bzstream_valid) {
			BZ2_bzDecompressEnd(&(zip->bzstream));
			zip->bzstream_valid = 0;
		}
		r = BZ2_bzDecompressInit(&(zip->bzstream), 0, 0);
		if (r == BZ_MEM_ERROR)
			r = BZ2_bzDecompressInit(&(zip->bzstream), 0, 1);
		if (r != BZ_OK) {
			int err = ARCHIVE_ERRNO_MISC;
			const char *detail = NULL;
			switch (r) {
			case BZ_PARAM_ERROR:
				detail = "invalid setup parameter";
				break;
			case BZ_MEM_ERROR:
				err = ENOMEM;
				detail = "out of memory";
				break;
			case BZ_CONFIG_ERROR:
				detail = "mis-compiled library";
				break;
			}
			archive_set_error(&a->archive, err,
			    "Internal error initializing decompressor: %s",
			    detail == NULL ? "??" : detail);
			zip->bzstream_valid = 0;
			return (ARCHIVE_FAILED);
		}
		zip->bzstream_valid = 1;
		zip->bzstream.total_in_lo32 = 0;
		zip->bzstream.total_in_hi32 = 0;
		zip->bzstream.total_out_lo32 = 0;
		zip->bzstream.total_out_hi32 = 0;
		break;
#else
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "BZ2 codec is unsupported");
		return (ARCHIVE_FAILED);
#endif
	case _7Z_DEFLATE:
#ifdef HAVE_ZLIB_H
		if (zip->stream_valid)
			r = inflateReset(&(zip->stream));
		else
			r = inflateInit2(&(zip->stream),
			    -15 /* Don't check for zlib header */);
		if (r != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Couldn't initialize zlib stream.");
			return (ARCHIVE_FAILED);
		}
		zip->stream_valid = 1;
		zip->stream.total_in = 0;
		zip->stream.total_out = 0;
		break;
#else
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "DEFLATE codec is unsupported");
		return (ARCHIVE_FAILED);
#endif
	case _7Z_PPMD:
	{
		unsigned order;
		uint32_t msize;

		if (zip->ppmd7_valid) {
			__archive_ppmd7_functions.Ppmd7_Free(
			    &zip->ppmd7_context, &g_szalloc);
			zip->ppmd7_valid = 0;
		}

		if (coder1->propertiesSize < 5) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed PPMd parameter");
			return (ARCHIVE_FAILED);
		}
		order = coder1->properties[0];
		msize = archive_le32dec(&(coder1->properties[1]));
		if (order < PPMD7_MIN_ORDER || order > PPMD7_MAX_ORDER ||
		    msize < PPMD7_MIN_MEM_SIZE || msize > PPMD7_MAX_MEM_SIZE) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed PPMd parameter");
			return (ARCHIVE_FAILED);
		}
		__archive_ppmd7_functions.Ppmd7_Construct(&zip->ppmd7_context);
		r = __archive_ppmd7_functions.Ppmd7_Alloc(
			&zip->ppmd7_context, msize, &g_szalloc);
		if (r == 0) {
			archive_set_error(&a->archive, ENOMEM,
			    "Coludn't allocate memory for PPMd");
			return (ARCHIVE_FATAL);
		}
		__archive_ppmd7_functions.Ppmd7_Init(
			&zip->ppmd7_context, order);
		__archive_ppmd7_functions.Ppmd7z_RangeDec_CreateVTable(
			&zip->range_dec);
		zip->ppmd7_valid = 1;
		zip->ppmd7_stat = 0;
		zip->ppstream.overconsumed = 0;
		zip->ppstream.total_in = 0;
		zip->ppstream.total_out = 0;
		break;
	}
	case _7Z_X86:
	case _7Z_X86_BCJ2:
	case _7Z_POWERPC:
	case _7Z_IA64:
	case _7Z_ARM:
	case _7Z_ARMTHUMB:
	case _7Z_SPARC:
	case _7Z_DELTA:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Unexpected codec ID: %lX", zip->codec);
		return (ARCHIVE_FAILED);
	case _7Z_CRYPTO_MAIN_ZIP:
	case _7Z_CRYPTO_RAR_29:
	case _7Z_CRYPTO_AES_256_SHA_256:
		if (a->entry) {
			archive_entry_set_is_metadata_encrypted(a->entry, 1);
			archive_entry_set_is_data_encrypted(a->entry, 1);
			zip->has_encrypted_entries = 1;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Crypto codec not supported yet (ID: 0x%lX)", zip->codec);
		return (ARCHIVE_FAILED);
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Unknown codec ID: %lX", zip->codec);
		return (ARCHIVE_FAILED);
	}

	return (ARCHIVE_OK);
}